

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O0

void http_parser_init_(http_parser *parser,http_parser_type t)

{
  void *pvVar1;
  uchar uVar2;
  void *data;
  http_parser_type t_local;
  http_parser *parser_local;
  
  pvVar1 = parser->data;
  memset(parser,0,0x20);
  parser->data = pvVar1;
  *(byte *)parser = *(byte *)parser & 0xfc | (byte)t & 3;
  if (t == HTTP_REQUEST) {
    uVar2 = '\x11';
  }
  else {
    uVar2 = '\x02';
    if (t == HTTP_RESPONSE) {
      uVar2 = '\x04';
    }
  }
  parser->state = uVar2;
  parser->field_0x17 = parser->field_0x17 & 0x80;
  return;
}

Assistant:

void
http_parser_init_ (http_parser *parser, enum http_parser_type t)
{
  void *data = parser->data; /* preserve application data */
  memset(parser, 0, sizeof(*parser));
  parser->data = data;
  parser->type = t;
  parser->state = (t == HTTP_REQUEST ? s_start_req : (t == HTTP_RESPONSE ? s_start_res : s_start_req_or_res));
  parser->http_errno = HPE_OK;
}